

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v10::detail::print(detail *this,FILE *f,string_view text)

{
  char *ptr;
  size_t count;
  FILE *f_local;
  string_view text_local;
  
  text_local.data_ = text.data_;
  f_local = f;
  ptr = basic_string_view<char>::data((basic_string_view<char> *)&f_local);
  count = basic_string_view<char>::size((basic_string_view<char> *)&f_local);
  fwrite_fully(ptr,count,(FILE *)this);
  return;
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
#ifdef _WIN32
  int fd = _fileno(f);
  if (_isatty(fd)) {
    std::fflush(f);
    if (write_console(fd, text)) return;
  }
#endif
  fwrite_fully(text.data(), text.size(), f);
}